

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

void Abc_NtkRecDumpTt3(char *pFileName,int fBinary)

{
  int nVars_00;
  Lms_Man_t *pLVar1;
  int iVar2;
  int iVar3;
  Vec_Str_t *pVVar4;
  Vec_Int_t *p_00;
  int *__base;
  word *pTruth_00;
  bool bVar5;
  int nEntries;
  int nVars;
  int Entry;
  int i;
  word *pTruth;
  Vec_Int_t *vEntries;
  Lms_Man_t *p;
  char pBuffer [1000];
  FILE *pFile;
  int fBinary_local;
  char *pFileName_local;
  
  pLVar1 = s_pMan3;
  nVars_00 = s_pMan3->nVars;
  iVar2 = Vec_MemEntryNum(s_pMan3->vTtMem);
  if (iVar2 == 0) {
    printf("There is not truth tables.\n");
  }
  else {
    pBuffer._992_8_ = fopen(pFileName,"wb");
    if ((FILE *)pBuffer._992_8_ == (FILE *)0x0) {
      printf("The file cannot be opened.\n");
    }
    else {
      pVVar4 = Vec_StrAlloc(iVar2);
      pLVar1->vSupps = pVVar4;
      nVars = 0;
      while( true ) {
        iVar3 = Vec_MemEntryNum(pLVar1->vTtMem);
        bVar5 = false;
        if (nVars < iVar3) {
          _Entry = Vec_MemReadEntry(pLVar1->vTtMem,nVars);
          bVar5 = _Entry != (word *)0x0;
        }
        if (!bVar5) break;
        pVVar4 = pLVar1->vSupps;
        iVar3 = Abc_TtSupportSize(_Entry,nVars_00);
        Vec_StrPush(pVVar4,(char)iVar3);
        nVars = nVars + 1;
      }
      p_00 = Vec_IntStartNatural(iVar2);
      __base = Vec_IntArray(p_00);
      qsort(__base,(long)iVar2,4,Abc_NtkRecTruthCompare);
      Vec_StrFreeP(&pLVar1->vSupps);
      for (nVars = 0; iVar2 = Vec_IntSize(p_00), nVars < iVar2; nVars = nVars + 1) {
        iVar2 = Vec_IntEntry(p_00,nVars);
        pTruth_00 = Vec_MemReadEntry(pLVar1->vTtMem,iVar2);
        if (fBinary == 0) {
          Extra_PrintHex((FILE *)pBuffer._992_8_,(uint *)pTruth_00,nVars_00);
          fprintf((FILE *)pBuffer._992_8_,"  ");
          Dau_DsdDecompose(pTruth_00,pLVar1->nVars,0,(uint)(nVars_00 < 0xb),(char *)&p);
          fprintf((FILE *)pBuffer._992_8_,"%s\n",&p);
        }
        else {
          fwrite(pTruth_00,1,(long)pLVar1->nWords << 3,(FILE *)pBuffer._992_8_);
        }
      }
      fclose((FILE *)pBuffer._992_8_);
      Vec_IntFree(p_00);
    }
  }
  return;
}

Assistant:

void Abc_NtkRecDumpTt3( char * pFileName, int fBinary )
{
    FILE * pFile;
    char pBuffer[1000];
    Lms_Man_t * p = s_pMan3;
    Vec_Int_t * vEntries;
    word * pTruth;
    int i, Entry, nVars = p->nVars;
    int nEntries = Vec_MemEntryNum(p->vTtMem);
    if ( nEntries == 0 )
    {
        printf( "There is not truth tables.\n" );
        return;
    }
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "The file cannot be opened.\n" );
        return;
    }
    p->vSupps = Vec_StrAlloc( nEntries );
    Vec_MemForEachEntry( p->vTtMem, pTruth, i )
        Vec_StrPush( p->vSupps, (char)Abc_TtSupportSize(pTruth, nVars) );
    vEntries = Vec_IntStartNatural( nEntries );
    qsort( (void *)Vec_IntArray(vEntries), (size_t)nEntries, sizeof(int), (int(*)(const void *,const void *))Abc_NtkRecTruthCompare );
    Vec_StrFreeP( &p->vSupps );
    // write the file
    Vec_IntForEachEntry( vEntries, Entry, i )
    {
        pTruth = Vec_MemReadEntry(p->vTtMem, Entry);
        if ( fBinary )
        {
            fwrite( pTruth, 1, sizeof(word) * p->nWords, pFile );
            continue;
        }
        Extra_PrintHex( pFile, (unsigned *)pTruth, nVars );
        fprintf( pFile, "  " );
//        Kit_DsdWriteFromTruth( pBuffer, (unsigned *)pTruth, nVars );
        Dau_DsdDecompose( pTruth, p->nVars, 0, (int)(nVars <= 10), pBuffer );
        fprintf( pFile, "%s\n", pBuffer );
    }
    fclose( pFile );
    Vec_IntFree( vEntries );
}